

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

ecs_reader_t * ecs_reader_init(ecs_reader_t *__return_storage_ptr__,ecs_world_t *world)

{
  ecs_reader_t *result;
  ecs_filter_t local_28;
  ecs_world_t *local_10;
  ecs_world_t *world_local;
  
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->state = EcsTableSegment;
  local_10 = world;
  ecs_filter_iter(&__return_storage_ptr__->data_iter,world,(ecs_filter_t *)0x0);
  __return_storage_ptr__->data_next = ecs_filter_next;
  local_28.include = FLECS__TEcsComponent;
  local_28.exclude = (ecs_type_t)0x0;
  local_28.include_kind = EcsMatchDefault;
  local_28.exclude_kind = EcsMatchDefault;
  ecs_filter_iter(&__return_storage_ptr__->component_iter,local_10,&local_28);
  __return_storage_ptr__->component_next = ecs_filter_next;
  memset(&__return_storage_ptr__->table,0,0x68);
  return __return_storage_ptr__;
}

Assistant:

ecs_reader_t ecs_reader_init(
    ecs_world_t *world)
{
    ecs_reader_t result = {
        .world = world,
        .state = EcsTableSegment,
        .component_iter = ecs_filter_iter(world, &(ecs_filter_t){
            .include = ecs_type(EcsComponent)
        }),
        .component_next = ecs_filter_next,
        .data_iter = ecs_filter_iter(world, NULL),
        .data_next = ecs_filter_next
    };

    return result;
}